

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::cmTargetInternals(cmTargetInternals *this,cmTargetInternals *param_1)

{
  Snapshot snapshot;
  PositionType local_40;
  Snapshot local_30;
  cmTargetInternals *local_18;
  cmTargetInternals *param_1_local;
  cmTargetInternals *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_40);
  cmState::Snapshot::Snapshot(&local_30,(cmState *)0x0,local_40);
  snapshot.Position.Tree = local_30.Position.Tree;
  snapshot.State = local_30.State;
  snapshot.Position.Position = local_30.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
  ::map(&this->LinkInterfaceMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
  ::map(&this->LinkInterfaceUsageRequirementsOnlyMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>_>
  ::map(&this->OutputInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>_>
  ::map(&this->ImportInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>_>
  ::map(&this->CompileInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap>_>_>
  ::map(&this->LinkImplMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>_>_>
  ::map(&this->LinkClosureMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::LinkImplClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::LinkImplClosure>_>_>
  ::map(&this->LinkImplClosureMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::CompatibleInterfaces,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::CompatibleInterfaces>_>_>
  ::map(&this->CompatibleInterfacesMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::map(&this->SourceFilesMap);
  std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set(&this->UtilityItems)
  ;
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::vector(&this->IncludeDirectoriesEntries);
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::vector(&this->CompileOptionsEntries);
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::vector(&this->CompileFeaturesEntries);
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::vector(&this->CompileDefinitionsEntries);
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::vector(&this->SourceEntries);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
            (&this->LinkImplementationPropertyEntries);
  this->PolicyWarnedCMP0022 = false;
  this->UtilityItemsDone = false;
  return;
}

Assistant:

cmTargetInternals(cmTargetInternals const&)
    : Backtrace()
    {
    this->PolicyWarnedCMP0022 = false;
    this->UtilityItemsDone = false;
    }